

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O3

void __thiscall
cfd::core::ConfidentialAssetId::ConfidentialAssetId(ConfidentialAssetId *this,ByteData *byte_data)

{
  uint8_t uVar1;
  pointer puVar2;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __last;
  size_t sVar3;
  CfdException *pCVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  undefined1 local_78 [32];
  ByteData local_58;
  CfdSourceLocation local_40;
  
  this->_vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_0025a000;
  ByteData::ByteData(&this->data_);
  this->version_ = '\0';
  sVar3 = ByteData::GetDataSize(byte_data);
  if (sVar3 == 0x20) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->data_,
               &byte_data->data_);
    this->version_ = '\x01';
  }
  else {
    if (sVar3 != 0x21) {
      if (sVar3 != 0) {
        local_78._0_8_ = "cfdcore_elements_transaction.cpp";
        local_78._8_4_ = 0x19c;
        local_78._16_8_ = "ConfidentialAssetId";
        local_40.filename = (char *)ByteData::GetDataSize(byte_data);
        logger::log<unsigned_long&>
                  ((CfdSourceLocation *)local_78,kCfdLogLevelWarning,
                   "AssetId size Invalid. size={}.",(unsigned_long *)&local_40);
        pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
        local_78._0_8_ = local_78 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_78,"AssetId size Invalid.","");
        CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_78);
        __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
      }
      local_40.filename = "cfdcore_elements_transaction.cpp";
      local_40.line = 0x187;
      local_40.funcname = "ConfidentialAssetId";
      ByteData::GetBytes(&local_58.data_,byte_data);
      StringUtil::ByteToString_abi_cxx11_((string *)local_78,(StringUtil *)&local_58,bytes);
      logger::log<std::__cxx11::string&>
                (&local_40,kCfdLogLevelWarning,"Empty ConfidentialAssetId. byte_data={}.",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
      if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
        operator_delete((void *)local_78._0_8_);
      }
      if (local_58.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_58.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      local_78._0_8_ = local_78 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_78,"Empty AssetId is invalid.","");
      CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_78);
      __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78,byte_data);
    __last._M_current._4_4_ = local_78._12_4_;
    __last._M_current._0_4_ = local_78._8_4_;
    ::std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_40,
               (uchar *)(local_78._0_8_ + 1),__last,(allocator_type *)&local_58);
    uVar1 = *(uint8_t *)local_78._0_8_;
    this->version_ = uVar1;
    if (uVar1 != '\0') {
      ByteData::ByteData(&local_58,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_40);
      puVar2 = (this->data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
               ._M_impl.super__Vector_impl_data._M_start;
      (this->data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_58.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
      (this->data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_58.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
      (this->data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_58.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_58.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_58.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_58.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if ((puVar2 != (pointer)0x0) &&
         (operator_delete(puVar2),
         local_58.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start != (pointer)0x0)) {
        operator_delete(local_58.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    if (local_40.filename != (char *)0x0) {
      operator_delete(local_40.filename);
    }
    if ((uint8_t *)local_78._0_8_ != (uint8_t *)0x0) {
      operator_delete((void *)local_78._0_8_);
    }
  }
  CheckVersion('\0');
  return;
}

Assistant:

ConfidentialAssetId::ConfidentialAssetId(const ByteData &byte_data)
    : data_(), version_(0) {
  switch (byte_data.GetDataSize()) {
    case 0:
      warn(
          CFD_LOG_SOURCE, "Empty ConfidentialAssetId. byte_data={}.",
          StringUtil::ByteToString(byte_data.GetBytes()));
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Empty AssetId is invalid.");
      break;
    case kAssetSize: {
      data_ = byte_data;
      version_ = kConfidentialVersion_1;
      break;
    }
    case kConfidentialDataSize: {
      const std::vector<uint8_t> &data = byte_data.GetBytes();
      std::vector<uint8_t> buffer(data.cbegin() + 1, data.cend());
      version_ = data[0];
      if (version_ != 0) {
        data_ = ByteData(buffer);
      }
      break;
    }
    default:
      warn(
          CFD_LOG_SOURCE, "AssetId size Invalid. size={}.",
          byte_data.GetDataSize());
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "AssetId size Invalid.");
  }
  CheckVersion(version_);
}